

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

string * __thiscall
(anonymous_namespace)::bothOrAll_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t count)

{
  char *pcVar1;
  
  if (this == (_anonymous_namespace_ *)0x1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = "all ";
    if (this == (_anonymous_namespace_ *)0x2) {
      pcVar1 = "both ";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (ulong)(this == (_anonymous_namespace_ *)0x2) + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bothOrAll( std::size_t count ) {
        return count == 1 ? std::string() :
               count == 2 ? "both " : "all " ;
    }